

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

unsigned_long
mxx::exscan<unsigned_long,std::plus<unsigned_long>>(undefined8 x,long param_2,undefined4 param_3)

{
  unsigned_long result;
  custom_op<unsigned_long> op;
  
  custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&op,param_3);
  MPI_Exscan(x,&result,1,op.m_type_copy,op.m_op,*(undefined8 *)(param_2 + 8));
  if (*(int *)(param_2 + 0x14) == 0) {
    result = 0;
  }
  custom_op<unsigned_long>::~custom_op(&op);
  return result;
}

Assistant:

T exscan(const T& x, Func func, const mxx::comm& comm = mxx::comm(), const bool commutative = true) {
    // get op
    mxx::custom_op<T> op(std::forward<Func>(func), commutative);
    // perform reduction
    T result;
    MPI_Exscan(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    if (comm.rank() == 0)
      result = T();
    return result;
}